

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokCVCCheck2(btok_cvc_t *cvc,btok_cvc_t *cvca)

{
  bool_t bVar1;
  int iVar2;
  void *in_RSI;
  err_t code;
  btok_cvc_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  err_t local_4;
  
  local_4 = btokCVCCheck(in_stack_ffffffffffffffd8);
  if (local_4 == 0) {
    bVar1 = memIsValid(in_RSI,0x128);
    if (bVar1 == 0) {
      local_4 = 0x6d;
    }
    else {
      iVar2 = strCmp((char *)CONCAT44(local_4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8->authority);
      if (iVar2 == 0) {
        bVar1 = tmDateIsValid2((octet *)CONCAT44(local_4,in_stack_ffffffffffffffe0));
        if ((((bVar1 == 0) ||
             (bVar1 = tmDateIsValid2((octet *)CONCAT44(local_4,in_stack_ffffffffffffffe0)),
             bVar1 == 0)) ||
            (bVar1 = tmDateLeq2((octet *)CONCAT44(local_4,in_stack_ffffffffffffffe0),
                                (octet *)in_stack_ffffffffffffffd8), bVar1 == 0)) ||
           (bVar1 = tmDateLeq2((octet *)CONCAT44(local_4,in_stack_ffffffffffffffe0),
                               (octet *)in_stack_ffffffffffffffd8), bVar1 == 0)) {
          local_4 = 0x134;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0x135;
      }
    }
  }
  return local_4;
}

Assistant:

err_t btokCVCCheck2(const btok_cvc_t* cvc, const btok_cvc_t* cvca)
{
	err_t code = btokCVCCheck(cvc);
	ERR_CALL_CHECK(code);
	if (!memIsValid(cvca, sizeof(btok_cvc_t)))
		return ERR_BAD_INPUT;
	if (!strEq(cvc->authority, cvca->holder))
		return ERR_BAD_NAME;
	if (!tmDateIsValid2(cvca->from) ||
		!tmDateIsValid2(cvca->until) ||
		!tmDateLeq2(cvca->from, cvc->from) ||
		!tmDateLeq2(cvc->from, cvca->until))
		return ERR_BAD_DATE;
	return ERR_OK;
}